

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O0

void __thiscall BehaviourTree::DecoratorNode::~DecoratorNode(DecoratorNode *this)

{
  code *pcVar1;
  DecoratorNode *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~DecoratorNode() {
            if (child != nullptr) {
                //delete child;
                child = nullptr;
            }
        }